

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

bool __thiscall
draco::PlyReader::ParseElementData(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  iterator iVar1;
  pointer pPVar2;
  int64_t iVar3;
  size_t __n;
  long lVar4;
  uint uVar5;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int64_t num_entries;
  long local_50;
  pointer local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = (this->elements_).
             super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar3 = local_48[element_index].num_entries_;
  if (0 < (int)iVar3) {
    local_48 = local_48 + element_index;
    lVar9 = *(long *)&(local_48->properties_).
                      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                      _M_impl;
    pPVar2 = *(pointer *)
              ((long)&(local_48->properties_).
                      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> +
              8);
    local_40 = 0;
    do {
      if (0 < (int)((ulong)((long)pPVar2 - lVar9) >> 5) * -0x55555555) {
        lVar8 = 0x38;
        lVar4 = 0;
        do {
          pvVar6 = (vector<unsigned_char,std::allocator<unsigned_char>> *)(lVar9 + lVar8 + -0x18);
          if (*(int *)(lVar9 + lVar8 + 0x20) == 0) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
                      (pvVar6,*(undefined8 *)(lVar9 + -0x10 + lVar8),buffer->data_ + buffer->pos_,
                       buffer->data_ + buffer->pos_ + *(int *)(lVar9 + 0x1c + lVar8));
            buffer->pos_ = buffer->pos_ + (long)*(int *)(lVar9 + 0x1c + lVar8);
          }
          else {
            local_50 = 0;
            __n = (size_t)*(int *)(lVar9 + 0x24 + lVar8);
            lVar7 = buffer->pos_ + __n;
            if (lVar7 <= buffer->data_size_) {
              memcpy(&local_50,buffer->data_ + buffer->pos_,__n);
              buffer->pos_ = lVar7;
            }
            local_38 = (ulong)(*(long *)(lVar9 + -0x10 + lVar8) - *(long *)(lVar9 + -0x18 + lVar8))
                       / (ulong)(long)*(int *)(lVar9 + 0x1c + lVar8);
            iVar1._M_current = *(long **)(lVar9 + 8 + lVar8);
            if (iVar1._M_current == *(long **)(lVar9 + 0x10 + lVar8)) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        ((vector<long,_std::allocator<long>_> *)(lVar9 + lVar8),iVar1,
                         (long *)&local_38);
            }
            else {
              *iVar1._M_current = local_38;
              *(long **)(lVar9 + 8 + lVar8) = iVar1._M_current + 1;
            }
            iVar1._M_current = *(long **)(lVar9 + 8 + lVar8);
            if (iVar1._M_current == *(long **)(lVar9 + 0x10 + lVar8)) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)(lVar9 + lVar8),iVar1,&local_50);
            }
            else {
              *iVar1._M_current = local_50;
              *(long **)(lVar9 + 8 + lVar8) = iVar1._M_current + 1;
            }
            lVar7 = *(int *)(lVar9 + 0x1c + lVar8) * local_50;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
                      (pvVar6,*(undefined8 *)(lVar9 + -0x10 + lVar8),buffer->data_ + buffer->pos_,
                       buffer->data_ + buffer->pos_ + lVar7);
            buffer->pos_ = buffer->pos_ + lVar7;
          }
          lVar4 = lVar4 + 1;
          lVar9 = *(long *)&(local_48->properties_).
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                            ._M_impl;
          pPVar2 = *(pointer *)
                    ((long)&(local_48->properties_).
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                    + 8);
          lVar8 = lVar8 + 0x60;
        } while (lVar4 < (int)((ulong)((long)pPVar2 - lVar9) >> 5) * -0x55555555);
        iVar3 = local_48->num_entries_;
      }
      uVar5 = (int)local_40 + 1;
      local_40 = (ulong)uVar5;
    } while ((int)uVar5 < (int)iVar3);
  }
  return true;
}

Assistant:

bool PlyReader::ParseElementData(DecoderBuffer *buffer, int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      if (prop.is_list()) {
        // Parse the number of entries for the list element.
        int64_t num_entries = 0;
        buffer->Decode(&num_entries, prop.list_data_type_num_bytes());
        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
        // Read and store the actual property data
        const int64_t num_bytes_to_read =
            prop.data_type_num_bytes() * num_entries;
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + num_bytes_to_read);
        buffer->Advance(num_bytes_to_read);
      } else {
        // Non-list property
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + prop.data_type_num_bytes());
        buffer->Advance(prop.data_type_num_bytes());
      }
    }
  }
  return true;
}